

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

CommandListVkImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::CommandListVkImpl,Diligent::FixedBlockMemoryAllocator>::operator()
          (MakeNewRCObj<Diligent::CommandListVkImpl,Diligent::FixedBlockMemoryAllocator> *this,
          RefCntAutoPtr<Diligent::RenderDeviceVkImpl> *CtorArgs,DeviceContextVkImpl **CtorArgs_1,
          VkCommandBuffer_T **CtorArgs_2)

{
  RenderDeviceVkImpl *pRVar1;
  RefCntAutoPtr<Diligent::RenderDeviceVkImpl> *pRVar2;
  CommandListVkImpl *local_40;
  CommandListVkImpl *pObj;
  IReferenceCounters *pRefCounters;
  RefCountersImpl *pNewRefCounters;
  VkCommandBuffer_T **CtorArgs_local_2;
  DeviceContextVkImpl **CtorArgs_local_1;
  RefCntAutoPtr<Diligent::RenderDeviceVkImpl> *CtorArgs_local;
  MakeNewRCObj<Diligent::CommandListVkImpl,_Diligent::FixedBlockMemoryAllocator> *this_local;
  
  pRefCounters = (IReferenceCounters *)0x0;
  pRVar2 = CtorArgs;
  if (*(long *)(this + 8) == 0) {
    pObj = (CommandListVkImpl *)::operator_new(0x30);
    RefCountersImpl::RefCountersImpl((RefCountersImpl *)pObj);
    pRefCounters = (IReferenceCounters *)pObj;
  }
  else {
    pObj = (CommandListVkImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
  }
  if (*(long *)this == 0) {
    local_40 = (CommandListVkImpl *)
               RefCountedObject<Diligent::ICommandList>::operator_new
                         ((RefCountedObject<Diligent::ICommandList> *)0x48,(size_t)pRVar2);
    pRVar1 = Diligent::RefCntAutoPtr::operator_cast_to_RenderDeviceVkImpl_
                       ((RefCntAutoPtr *)CtorArgs);
    CommandListVkImpl::CommandListVkImpl
              (local_40,(IReferenceCounters *)pObj,pRVar1,*CtorArgs_1,*CtorArgs_2);
  }
  else {
    local_40 = (CommandListVkImpl *)
               ::new<Diligent::FixedBlockMemoryAllocator>
                         (0x48,*(FixedBlockMemoryAllocator **)this,*(Char **)(this + 0x10),
                          *(char **)(this + 0x18),*(Int32 *)(this + 0x20));
    pRVar1 = Diligent::RefCntAutoPtr::operator_cast_to_RenderDeviceVkImpl_
                       ((RefCntAutoPtr *)CtorArgs);
    CommandListVkImpl::CommandListVkImpl
              (local_40,(IReferenceCounters *)pObj,pRVar1,*CtorArgs_1,*CtorArgs_2);
  }
  if (pRefCounters != (IReferenceCounters *)0x0) {
    RefCountersImpl::Attach<Diligent::CommandListVkImpl,Diligent::FixedBlockMemoryAllocator>
              ((RefCountersImpl *)pRefCounters,local_40,*(FixedBlockMemoryAllocator **)this);
  }
  return local_40;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }